

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

void __thiscall Symbol::RestoreHasFuncAssignment(Symbol *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  CharacterBuffer<char16_t> *this_00;
  char16_t *pcVar4;
  Symbol *this_local;
  
  if ((bool)(this->hasFuncAssignment & 1U) != (this->symbolType == STFunction)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0xaf,"(hasFuncAssignment == (this->symbolType == STFunction))",
                       "hasFuncAssignment == (this->symbolType == STFunction)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = GetIsFormal(this);
  if ((!bVar2) && (bVar2 = GetHasMaybeEscapedUse(this), bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0xb0,"(this->GetIsFormal() || !this->GetHasMaybeEscapedUse())",
                       "this->GetIsFormal() || !this->GetHasMaybeEscapedUse()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->hasFuncAssignment = true;
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,StackFuncPhase);
  if (bVar2) {
    this_00 = GetName(this);
    pcVar4 = JsUtil::CharacterBuffer<char16_t>::GetBuffer(this_00);
    Output::Print(L"RestoreHasFuncAssignment: %s\n",pcVar4);
    Output::Flush();
  }
  return;
}

Assistant:

void Symbol::RestoreHasFuncAssignment()
{
    Assert(hasFuncAssignment == (this->symbolType == STFunction));
    Assert(this->GetIsFormal() || !this->GetHasMaybeEscapedUse());
    hasFuncAssignment = true;
    if (PHASE_TESTTRACE1(Js::StackFuncPhase))
    {
        Output::Print(_u("RestoreHasFuncAssignment: %s\n"), this->GetName().GetBuffer());
        Output::Flush();
    }
}